

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall cimg_library::CImgDisplay::set_key(CImgDisplay *this)

{
  X11_info *pXVar1;
  CImgDisplay *this_local;
  
  memset(this->_keys,0,0x200);
  memset(this->_released_keys,0,0x200);
  this->_is_keyPADDIV = false;
  this->_is_keyPADMUL = (bool)(this->_is_keyPADDIV & 1);
  this->_is_keyPADSUB = (bool)(this->_is_keyPADMUL & 1);
  this->_is_keyPADADD = (bool)(this->_is_keyPADSUB & 1);
  this->_is_keyPAD9 = (bool)(this->_is_keyPADADD & 1);
  this->_is_keyPAD8 = (bool)(this->_is_keyPAD9 & 1);
  this->_is_keyPAD7 = (bool)(this->_is_keyPAD8 & 1);
  this->_is_keyPAD6 = (bool)(this->_is_keyPAD7 & 1);
  this->_is_keyPAD5 = (bool)(this->_is_keyPAD6 & 1);
  this->_is_keyPAD4 = (bool)(this->_is_keyPAD5 & 1);
  this->_is_keyPAD3 = (bool)(this->_is_keyPAD4 & 1);
  this->_is_keyPAD2 = (bool)(this->_is_keyPAD3 & 1);
  this->_is_keyPAD1 = (bool)(this->_is_keyPAD2 & 1);
  this->_is_keyPAD0 = (bool)(this->_is_keyPAD1 & 1);
  this->_is_keyARROWRIGHT = (bool)(this->_is_keyPAD0 & 1);
  this->_is_keyARROWDOWN = (bool)(this->_is_keyARROWRIGHT & 1);
  this->_is_keyARROWLEFT = (bool)(this->_is_keyARROWDOWN & 1);
  this->_is_keyCTRLRIGHT = (bool)(this->_is_keyARROWLEFT & 1);
  this->_is_keyMENU = (bool)(this->_is_keyCTRLRIGHT & 1);
  this->_is_keyAPPRIGHT = (bool)(this->_is_keyMENU & 1);
  this->_is_keyALTGR = (bool)(this->_is_keyAPPRIGHT & 1);
  this->_is_keySPACE = (bool)(this->_is_keyALTGR & 1);
  this->_is_keyALT = (bool)(this->_is_keySPACE & 1);
  this->_is_keyAPPLEFT = (bool)(this->_is_keyALT & 1);
  this->_is_keyCTRLLEFT = (bool)(this->_is_keyAPPLEFT & 1);
  this->_is_keyARROWUP = (bool)(this->_is_keyCTRLLEFT & 1);
  this->_is_keySHIFTRIGHT = (bool)(this->_is_keyARROWUP & 1);
  this->_is_keyM = (bool)(this->_is_keySHIFTRIGHT & 1);
  this->_is_keyN = (bool)(this->_is_keyM & 1);
  this->_is_keyB = (bool)(this->_is_keyN & 1);
  this->_is_keyV = (bool)(this->_is_keyB & 1);
  this->_is_keyC = (bool)(this->_is_keyV & 1);
  this->_is_keyX = (bool)(this->_is_keyC & 1);
  this->_is_keyZ = (bool)(this->_is_keyX & 1);
  this->_is_keySHIFTLEFT = (bool)(this->_is_keyZ & 1);
  this->_is_keyENTER = (bool)(this->_is_keySHIFTLEFT & 1);
  this->_is_keyL = (bool)(this->_is_keyENTER & 1);
  this->_is_keyK = (bool)(this->_is_keyL & 1);
  this->_is_keyJ = (bool)(this->_is_keyK & 1);
  this->_is_keyH = (bool)(this->_is_keyJ & 1);
  this->_is_keyG = (bool)(this->_is_keyH & 1);
  this->_is_keyF = (bool)(this->_is_keyG & 1);
  this->_is_keyD = (bool)(this->_is_keyF & 1);
  this->_is_keyS = (bool)(this->_is_keyD & 1);
  this->_is_keyA = (bool)(this->_is_keyS & 1);
  this->_is_keyCAPSLOCK = (bool)(this->_is_keyA & 1);
  this->_is_keyPAGEDOWN = (bool)(this->_is_keyCAPSLOCK & 1);
  this->_is_keyEND = (bool)(this->_is_keyPAGEDOWN & 1);
  this->_is_keyDELETE = (bool)(this->_is_keyEND & 1);
  this->_is_keyP = (bool)(this->_is_keyDELETE & 1);
  this->_is_keyO = (bool)(this->_is_keyP & 1);
  this->_is_keyI = (bool)(this->_is_keyO & 1);
  this->_is_keyU = (bool)(this->_is_keyI & 1);
  this->_is_keyY = (bool)(this->_is_keyU & 1);
  this->_is_keyT = (bool)(this->_is_keyY & 1);
  this->_is_keyR = (bool)(this->_is_keyT & 1);
  this->_is_keyE = (bool)(this->_is_keyR & 1);
  this->_is_keyW = (bool)(this->_is_keyE & 1);
  this->_is_keyQ = (bool)(this->_is_keyW & 1);
  this->_is_keyTAB = (bool)(this->_is_keyQ & 1);
  this->_is_keyPAGEUP = (bool)(this->_is_keyTAB & 1);
  this->_is_keyHOME = (bool)(this->_is_keyPAGEUP & 1);
  this->_is_keyINSERT = (bool)(this->_is_keyHOME & 1);
  this->_is_keyBACKSPACE = (bool)(this->_is_keyINSERT & 1);
  this->_is_key0 = (bool)(this->_is_keyBACKSPACE & 1);
  this->_is_key9 = (bool)(this->_is_key0 & 1);
  this->_is_key8 = (bool)(this->_is_key9 & 1);
  this->_is_key7 = (bool)(this->_is_key8 & 1);
  this->_is_key6 = (bool)(this->_is_key7 & 1);
  this->_is_key5 = (bool)(this->_is_key6 & 1);
  this->_is_key4 = (bool)(this->_is_key5 & 1);
  this->_is_key3 = (bool)(this->_is_key4 & 1);
  this->_is_key2 = (bool)(this->_is_key3 & 1);
  this->_is_key1 = (bool)(this->_is_key2 & 1);
  this->_is_keyPAUSE = (bool)(this->_is_key1 & 1);
  this->_is_keyF12 = (bool)(this->_is_keyPAUSE & 1);
  this->_is_keyF11 = (bool)(this->_is_keyF12 & 1);
  this->_is_keyF10 = (bool)(this->_is_keyF11 & 1);
  this->_is_keyF9 = (bool)(this->_is_keyF10 & 1);
  this->_is_keyF8 = (bool)(this->_is_keyF9 & 1);
  this->_is_keyF7 = (bool)(this->_is_keyF8 & 1);
  this->_is_keyF6 = (bool)(this->_is_keyF7 & 1);
  this->_is_keyF5 = (bool)(this->_is_keyF6 & 1);
  this->_is_keyF4 = (bool)(this->_is_keyF5 & 1);
  this->_is_keyF3 = (bool)(this->_is_keyF4 & 1);
  this->_is_keyF2 = (bool)(this->_is_keyF3 & 1);
  this->_is_keyF1 = (bool)(this->_is_keyF2 & 1);
  this->_is_keyESC = (bool)(this->_is_keyF1 & 1);
  this->_is_event = true;
  pXVar1 = cimg::X11_attr();
  pthread_cond_broadcast((pthread_cond_t *)&pXVar1->wait_event);
  return this;
}

Assistant:

CImgDisplay& set_key() {
      std::memset((void*)_keys,0,sizeof(_keys));
      std::memset((void*)_released_keys,0,sizeof(_released_keys));
      _is_keyESC = _is_keyF1 = _is_keyF2 = _is_keyF3 = _is_keyF4 = _is_keyF5 = _is_keyF6 = _is_keyF7 = _is_keyF8 = _is_keyF9 =
        _is_keyF10 = _is_keyF11 = _is_keyF12 = _is_keyPAUSE = _is_key1 = _is_key2 = _is_key3 = _is_key4 = _is_key5 = _is_key6 =
        _is_key7 = _is_key8 = _is_key9 = _is_key0 = _is_keyBACKSPACE = _is_keyINSERT = _is_keyHOME = _is_keyPAGEUP = _is_keyTAB =
        _is_keyQ = _is_keyW = _is_keyE = _is_keyR = _is_keyT = _is_keyY = _is_keyU = _is_keyI = _is_keyO = _is_keyP = _is_keyDELETE =
        _is_keyEND = _is_keyPAGEDOWN = _is_keyCAPSLOCK = _is_keyA = _is_keyS = _is_keyD = _is_keyF = _is_keyG = _is_keyH = _is_keyJ =
        _is_keyK = _is_keyL = _is_keyENTER = _is_keySHIFTLEFT = _is_keyZ = _is_keyX = _is_keyC = _is_keyV = _is_keyB = _is_keyN =
        _is_keyM = _is_keySHIFTRIGHT = _is_keyARROWUP = _is_keyCTRLLEFT = _is_keyAPPLEFT = _is_keyALT = _is_keySPACE = _is_keyALTGR = _is_keyAPPRIGHT =
        _is_keyMENU = _is_keyCTRLRIGHT = _is_keyARROWLEFT = _is_keyARROWDOWN = _is_keyARROWRIGHT = _is_keyPAD0 = _is_keyPAD1 = _is_keyPAD2 =
        _is_keyPAD3 = _is_keyPAD4 = _is_keyPAD5 = _is_keyPAD6 = _is_keyPAD7 = _is_keyPAD8 = _is_keyPAD9 = _is_keyPADADD = _is_keyPADSUB =
        _is_keyPADMUL = _is_keyPADDIV = false;
      _is_event = true;
#if cimg_display==1
      pthread_cond_broadcast(&cimg::X11_attr().wait_event);
#elif cimg_display==2
      SetEvent(cimg::Win32_attr().wait_event);
#endif
      return *this;
    }